

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommsInterface.cpp
# Opt level: O1

void __thiscall helics::CommsInterface::join_tx_rx_thread(CommsInterface *this)

{
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->threadSyncLock);
  if (iVar1 == 0) {
    if ((this->singleThread == false) && ((this->queue_watcher)._M_id._M_thread != 0)) {
      std::thread::join();
    }
    if ((this->queue_transmitter)._M_id._M_thread != 0) {
      std::thread::join();
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->threadSyncLock);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void CommsInterface::join_tx_rx_thread()
{
    const std::lock_guard<std::mutex> syncLock(threadSyncLock);
    if (!singleThread) {
        if (queue_watcher.joinable()) {
            queue_watcher.join();
        }
    }
    if (queue_transmitter.joinable()) {
        queue_transmitter.join();
    }
}